

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelUri.cpp
# Opt level: O0

void __thiscall
aeron::archive::ChannelUri::ChannelUri
          (ChannelUri *this,string *prefix,string *media,ParamsMap *params)

{
  ParamsMap *params_local;
  string *media_local;
  string *prefix_local;
  ChannelUri *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)prefix);
  std::__cxx11::string::string((string *)&this->media_,(string *)media);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(&this->params_,params);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->tags_);
  return;
}

Assistant:

ChannelUri::ChannelUri(const std::string& prefix, const std::string& media, ParamsMap&& params)
    : prefix_(prefix)
    , media_(media)
    , params_(std::move(params)) {
    // TODO: tags are not parsed, however these are not needed for the archive client
}